

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserUpdateView.cpp
# Opt level: O0

void __thiscall UserUpdateView::display(UserUpdateView *this)

{
  BaseUser *this_00;
  bool bVar1;
  char cVar2;
  int iVar3;
  Application *this_01;
  BaseUser *pBVar4;
  char *pcVar5;
  UserCreateUpdateForm *this_02;
  undefined4 extraout_var;
  Controller *pCVar6;
  View *local_398;
  bool local_30b;
  allocator local_309;
  string local_308;
  byte local_2e3;
  byte local_2e2;
  allocator local_2e1;
  string local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  BaseUser *local_220;
  BaseUser *user;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [55];
  bool local_181;
  undefined1 local_180 [7];
  bool adminStatus;
  string password;
  string lastName;
  string firstName;
  string email;
  BaseUser loggedInUser;
  UserUpdateView *this_local;
  
  this_01 = Application::getInstance();
  pBVar4 = Application::getCurrentUser(this_01);
  this_00 = (BaseUser *)((long)&email.field_2 + 8);
  BaseUser::BaseUser(this_00,pBVar4);
  std::operator<<((ostream *)&std::cout,"To update a user fill in the details asked below: \n");
  std::__cxx11::string::string((string *)(firstName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(lastName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(password.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_180);
  bVar1 = BaseUser::isAdmin(this_00);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"Email: ");
    Input::getEmail_abi_cxx11_();
    std::__cxx11::string::operator=((string *)(firstName.field_2._M_local_buf + 8),local_1b8);
    std::__cxx11::string::~string(local_1b8);
  }
  else {
    pcVar5 = BaseUser::getEmail((BaseUser *)((long)&email.field_2 + 8));
    std::__cxx11::string::operator=((string *)(firstName.field_2._M_local_buf + 8),pcVar5);
  }
  std::operator<<((ostream *)&std::cout,"First name: ");
  Input::getString_abi_cxx11_();
  std::__cxx11::string::operator=((string *)(lastName.field_2._M_local_buf + 8),local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::operator<<((ostream *)&std::cout,"Last name: ");
  Input::getString_abi_cxx11_();
  std::__cxx11::string::operator=((string *)(password.field_2._M_local_buf + 8),local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::operator<<((ostream *)&std::cout,"Password: ");
  Input::getPassword_abi_cxx11_();
  std::__cxx11::string::operator=((string *)local_180,(string *)&user);
  std::__cxx11::string::~string((string *)&user);
  bVar1 = BaseUser::isAdmin((BaseUser *)((long)&email.field_2 + 8));
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"Should this user be an admin? (y/n): ");
    cVar2 = Input::getChar();
    local_181 = cVar2 == 'y';
  }
  else {
    local_181 = false;
  }
  local_220 = BaseUser::findByEmail((string *)((long)&firstName.field_2 + 8));
  if (local_220 == (BaseUser *)0x0) {
    std::operator+(&local_2c0,"A user with ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&firstName.field_2 + 8));
    std::operator+(&local_2a0,&local_2c0," email address doesn\'t exist.\n");
    std::operator<<((ostream *)&std::cout,(string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  else {
    this_02 = (UserCreateUpdateForm *)operator_new(0xb0);
    UserCreateUpdateForm::UserCreateUpdateForm
              (this_02,(string *)((long)&lastName.field_2 + 8),
               (string *)((long)&password.field_2 + 8),(string *)((long)&firstName.field_2 + 8),
               (string *)local_180,(bool)(local_181 & 1),local_220);
    (this->super_UpdateView<BaseUser>).form = (ModelForm<BaseUser> *)this_02;
    bVar1 = Form::isValid(&((this->super_UpdateView<BaseUser>).form)->super_Form);
    if (bVar1) {
      iVar3 = (*(((this->super_UpdateView<BaseUser>).form)->super_Form)._vptr_Form[1])();
      local_220 = (BaseUser *)CONCAT44(extraout_var,iVar3);
      BaseUser::getFullName_abi_cxx11_(&local_280,local_220);
      std::operator+(&local_260,"User ",&local_280);
      std::operator+(&local_240,&local_260," updated successfully.\n");
      std::operator<<((ostream *)&std::cout,(string *)&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
    }
    else {
      Form::printErrors(&((this->super_UpdateView<BaseUser>).form)->super_Form);
    }
  }
  local_2e2 = 0;
  local_2e3 = 0;
  local_30b = BaseUser::isAdmin((BaseUser *)((long)&email.field_2 + 8));
  if (local_30b) {
    pCVar6 = Controller::getInstance();
    std::allocator<char>::allocator();
    local_2e2 = 1;
    std::__cxx11::string::string((string *)&local_2e0,"admin-panel",&local_2e1);
    local_2e3 = 1;
    local_398 = Controller::getView(pCVar6,&local_2e0);
  }
  else {
    pCVar6 = Controller::getInstance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_308,"faculty-panel",&local_309);
    local_398 = Controller::getView(pCVar6,&local_308);
  }
  local_30b = !local_30b;
  View::response->view = local_398;
  if (local_30b) {
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator((allocator<char> *)&local_309);
  }
  if ((local_2e3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  if ((local_2e2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  }
  std::__cxx11::string::~string((string *)local_180);
  std::__cxx11::string::~string((string *)(password.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(lastName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(firstName.field_2._M_local_buf + 8));
  return;
}

Assistant:

void UserUpdateView::display() {
    BaseUser loggedInUser = *Application::getInstance().getCurrentUser();
    cout << "To update a user fill in the details asked below: \n";
    string email, firstName, lastName, password;
    bool adminStatus;
    if (loggedInUser.isAdmin()) {
        cout << "Email: ";
        email = Input::getEmail();
    } else {
        email = loggedInUser.getEmail();
    }
    cout << "First name: ";
    firstName = Input::getString();
    cout << "Last name: ";
    lastName = Input::getString();
    cout << "Password: ";
    password = Input::getPassword();
    if (loggedInUser.isAdmin()) {
        cout << "Should this user be an admin? (y/n): ";
        adminStatus = (Input::getChar() == 'y');
    } else adminStatus = false;
    BaseUser *user = BaseUser::findByEmail(email);
    if (user) {
        form = new UserCreateUpdateForm(firstName, lastName, email, password, adminStatus, user);
        if (form->isValid()) {
            user = &form->save();
            cout << "User " + user->getFullName() + " updated successfully.\n";
        } else {
            form->printErrors();
        }
    } else {
        cout << "A user with " + email + " email address doesn't exist.\n";
    }
    response->view = loggedInUser.isAdmin() ? Controller::getInstance().getView("admin-panel")
                                            : Controller::getInstance().getView("faculty-panel");
}